

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeLockTable(Btree *p,int iTab,u8 isWriteLock)

{
  int *piVar1;
  BtShared *pBVar2;
  sqlite3_mutex *psVar3;
  int iVar4;
  BtLock *pBVar5;
  byte eLock;
  
  if (p->sharable == '\0') {
    return 0;
  }
  eLock = isWriteLock + 1;
  sqlite3BtreeEnter(p);
  iVar4 = querySharedCacheTableLock(p,iTab,eLock);
  if (iVar4 == 0) {
    pBVar2 = p->pBt;
    for (pBVar5 = pBVar2->pLock; pBVar5 != (BtLock *)0x0; pBVar5 = pBVar5->pNext) {
      if ((pBVar5->iTable == iTab) && (pBVar5->pBtree == p)) goto LAB_0016e784;
    }
    pBVar5 = (BtLock *)0x0;
LAB_0016e784:
    if (pBVar5 == (BtLock *)0x0) {
      pBVar5 = (BtLock *)sqlite3Malloc(0x18);
      if (pBVar5 == (BtLock *)0x0) {
        iVar4 = 7;
        goto LAB_0016e7ce;
      }
      pBVar5->pBtree = (Btree *)0x0;
      pBVar5->iTable = 0;
      pBVar5->eLock = '\0';
      *(undefined3 *)&pBVar5->field_0xd = 0;
      pBVar5->pNext = (BtLock *)0x0;
      pBVar5->iTable = iTab;
      pBVar5->pBtree = p;
      pBVar5->pNext = pBVar2->pLock;
      pBVar2->pLock = pBVar5;
    }
    iVar4 = 0;
    if (pBVar5->eLock < eLock) {
      pBVar5->eLock = eLock;
    }
  }
LAB_0016e7ce:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar3 = p->pBt->mutex;
      if (psVar3 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
      }
      p->locked = '\0';
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeLockTable(Btree *p, int iTab, u8 isWriteLock){
  int rc = SQLITE_OK;
  assert( p->inTrans!=TRANS_NONE );
  if( p->sharable ){
    u8 lockType = READ_LOCK + isWriteLock;
    assert( READ_LOCK+1==WRITE_LOCK );
    assert( isWriteLock==0 || isWriteLock==1 );

    sqlite3BtreeEnter(p);
    rc = querySharedCacheTableLock(p, iTab, lockType);
    if( rc==SQLITE_OK ){
      rc = setSharedCacheTableLock(p, iTab, lockType);
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}